

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp
# Opt level: O2

void __thiscall
glcts::MultisampleTextureGetTexLevelParametervFunctionalTest::
MultisampleTextureGetTexLevelParametervFunctionalTest
          (MultisampleTextureGetTexLevelParametervFunctionalTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"functional_test",
             "Verifies glGetTexLevelParameter{if}v() entry-points work correctly for all ES3.1 texture targets."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dfc850;
  this->gl_oes_texture_storage_multisample_2d_array_supported = '\0';
  this->to_2d = 0;
  this->to_2d_array = 0;
  this->to_2d_multisample = 0;
  this->to_2d_multisample_array = 0;
  this->to_3d = 0;
  this->to_cubemap = 0;
  return;
}

Assistant:

MultisampleTextureGetTexLevelParametervFunctionalTest::MultisampleTextureGetTexLevelParametervFunctionalTest(
	Context& context)
	: TestCase(context, "functional_test", "Verifies glGetTexLevelParameter{if}v() entry-points "
										   "work correctly for all ES3.1 texture targets.")
	, gl_oes_texture_storage_multisample_2d_array_supported(GL_FALSE)
	, to_2d(0)
	, to_2d_array(0)
	, to_2d_multisample(0)
	, to_2d_multisample_array(0)
	, to_3d(0)
	, to_cubemap(0)
{
	/* Left blank on purpose */
}